

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O0

int ffourl(char *url,char *urltype,char *outfile,char *tpltfile,char *compspec,int *status)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  size_t sVar4;
  char *pcVar5;
  char *in_RCX;
  char *in_RDX;
  char *in_RSI;
  char *in_RDI;
  char *in_R8;
  int *in_R9;
  char *ptr3;
  char *ptr2;
  char *ptr1;
  char *local_40;
  
  if (0 < *in_R9) {
    return *in_R9;
  }
  if (in_RSI != (char *)0x0) {
    *in_RSI = '\0';
  }
  if (in_RDX != (char *)0x0) {
    *in_RDX = '\0';
  }
  if (in_RCX != (char *)0x0) {
    *in_RCX = '\0';
  }
  local_40 = in_RDI;
  if (in_R8 != (char *)0x0) {
    *in_R8 = '\0';
  }
  for (; *local_40 == ' '; local_40 = local_40 + 1) {
  }
  if (((*local_40 == '-') && ((local_40[1] == '\0' || (local_40[1] == ' ')))) ||
     ((iVar1 = strcmp(local_40,"stdout"), iVar1 == 0 ||
      (iVar1 = strcmp(local_40,"STDOUT"), iVar1 == 0)))) {
    if (in_RSI != (char *)0x0) {
      strcpy(in_RSI,"stdout://");
    }
  }
  else {
    pcVar2 = strstr(local_40,"://");
    if (pcVar2 == (char *)0x0) {
      if (in_RSI != (char *)0x0) {
        strcat(in_RSI,"file://");
      }
    }
    else {
      if (in_RSI != (char *)0x0) {
        if (0x13 < (long)(pcVar2 + (3 - (long)local_40))) {
          *in_R9 = 0x7d;
          return 0x7d;
        }
        strncat(in_RSI,local_40,(size_t)(pcVar2 + (3 - (long)local_40)));
      }
      local_40 = pcVar2 + 3;
    }
    pcVar2 = strchr(local_40,0x28);
    pcVar3 = strchr(local_40,0x5b);
    if (in_RDX != (char *)0x0) {
      if (pcVar2 == (char *)0x0) {
        if (pcVar3 == (char *)0x0) {
          sVar4 = strlen(local_40);
          if (0x400 < sVar4) {
            *in_R9 = 0x7d;
            return 0x7d;
          }
          strcpy(in_RDX,local_40);
        }
        else {
          if (0x400 < (long)pcVar3 - (long)local_40) {
            *in_R9 = 0x7d;
            return 0x7d;
          }
          strncat(in_RDX,local_40,(long)pcVar3 - (long)local_40);
        }
      }
      else {
        if (0x400 < (long)pcVar2 - (long)local_40) {
          *in_R9 = 0x7d;
          return 0x7d;
        }
        strncat(in_RDX,local_40,(long)pcVar2 - (long)local_40);
      }
    }
    if (pcVar2 != (char *)0x0) {
      pcVar2 = pcVar2 + 1;
      pcVar5 = strchr(pcVar2,0x29);
      if (pcVar5 == (char *)0x0) {
        *in_R9 = 0x7d;
        return 0x7d;
      }
      if (in_RCX != (char *)0x0) {
        if (0x400 < (long)pcVar5 - (long)pcVar2) {
          *in_R9 = 0x7d;
          return 0x7d;
        }
        strncat(in_RCX,pcVar2,(long)pcVar5 - (long)pcVar2);
      }
    }
    if (pcVar3 != (char *)0x0) {
      pcVar3 = pcVar3 + 1;
      pcVar2 = strchr(pcVar3,0x5d);
      if (pcVar2 == (char *)0x0) {
        *in_R9 = 0x7d;
        return 0x7d;
      }
      if (in_R8 != (char *)0x0) {
        if (0x400 < (long)pcVar2 - (long)pcVar3) {
          *in_R9 = 0x7d;
          return 0x7d;
        }
        strncat(in_R8,pcVar3,(long)pcVar2 - (long)pcVar3);
      }
    }
    if ((((in_RSI != (char *)0x0) && (in_RDX != (char *)0x0)) &&
        (iVar1 = strcmp(in_RSI,"file://"), iVar1 == 0)) &&
       ((pcVar2 = strstr(in_RDX,".gz"), pcVar2 != (char *)0x0 &&
        ((pcVar2[3] == '\0' || (pcVar2[3] == ' ')))))) {
      strcpy(in_RSI,"compressoutfile://");
    }
  }
  return *in_R9;
}

Assistant:

int ffourl(char *url,             /* I - full input URL   */
           char *urltype,          /* O - url type         */
           char *outfile,          /* O - base file name   */
           char *tpltfile,         /* O - template file name, if any */
           char *compspec,         /* O - compression specification, if any */
           int *status)
/*
   parse the output URL into its basic components.
*/

{ 
    char *ptr1, *ptr2, *ptr3;

    if (*status > 0)
        return(*status);

    if (urltype)
      *urltype = '\0';
    if (outfile)
      *outfile = '\0';
    if (tpltfile)
      *tpltfile = '\0';
    if (compspec)
      *compspec = '\0';

    ptr1 = url;
    while (*ptr1 == ' ')    /* ignore leading blanks */
           ptr1++;

    if ( ( (*ptr1 == '-') &&  ( *(ptr1 +1) ==  0   || *(ptr1 +1) == ' ' ) )
         ||  !strcmp(ptr1, "stdout")
         ||  !strcmp(ptr1, "STDOUT"))

         /* "-" means write to stdout;  also support "- "            */
         /* but exclude disk file names that begin with a minus sign */
         /* e.g., "-55d33m.fits"   */
    {
      if (urltype)
        strcpy(urltype, "stdout://");
    }
    else
    {
        /* not writing to stdout */
        /*  get urltype (e.g., file://, ftp://, http://, etc.)  */

        ptr2 = strstr(ptr1, "://");
        if (ptr2)                  /* copy the explicit urltype string */ 
        {
          if (urltype) {
	    if (ptr2 - ptr1 + 3 > MAX_PREFIX_LEN - 1)
	    {
                return(*status = URL_PARSE_ERROR); 
            }

            strncat(urltype, ptr1, ptr2 - ptr1 + 3);
          }

          ptr1 = ptr2 + 3;
        }
        else                       /* assume file driver    */
        {
          if (urltype)
             strcat(urltype, "file://");
        }

        /* look for template file name, enclosed in parenthesis */
        ptr2 = strchr(ptr1, '('); 

        /* look for image compression parameters, enclosed in sq. brackets */
        ptr3 = strchr(ptr1, '['); 

        if (outfile)
        {
          if (ptr2) {  /* template file was specified  */
	     if (ptr2 - ptr1 > FLEN_FILENAME - 1)
	     {
                return(*status = URL_PARSE_ERROR); 
             }
 
             strncat(outfile, ptr1, ptr2 - ptr1);
          } else if (ptr3) {  /* compression was specified  */
	     if (ptr3 - ptr1 > FLEN_FILENAME - 1)
	     {
                return(*status = URL_PARSE_ERROR); 
             }
             strncat(outfile, ptr1, ptr3 - ptr1);

          } else { /* no template file or compression */
	     if (strlen(ptr1) > FLEN_FILENAME - 1)
	     {
                return(*status = URL_PARSE_ERROR); 
             }
             strcpy(outfile, ptr1);
          }
        }


        if (ptr2)   /* template file was specified  */
        {
            ptr2++;

            ptr1 = strchr(ptr2, ')' );   /* search for closing ) */

            if (!ptr1)
            {
                return(*status = URL_PARSE_ERROR);  /* error, no closing ) */
            }

            if (tpltfile) {
	        if (ptr1 - ptr2 > FLEN_FILENAME - 1)
	        {
                   return(*status = URL_PARSE_ERROR); 
                }
                 strncat(tpltfile, ptr2, ptr1 - ptr2);
            }
        }
        
        if (ptr3)   /* compression was specified  */
        {
            ptr3++;

            ptr1 = strchr(ptr3, ']' );   /* search for closing ] */

            if (!ptr1)
            {
                return(*status = URL_PARSE_ERROR);  /* error, no closing ] */
            }

            if (compspec) {

	        if (ptr1 - ptr3 > FLEN_FILENAME - 1)
	        {
                   return(*status = URL_PARSE_ERROR); 
                }
 
                strncat(compspec, ptr3, ptr1 - ptr3);
            }
        }

        /* check if a .gz compressed output file is to be created */
        /* by seeing if the filename ends in '.gz'   */
        if (urltype && outfile)
        {
            if (!strcmp(urltype, "file://") )
            {
                ptr1 = strstr(outfile, ".gz");
                if (ptr1)
                {    /* make sure the ".gz" is at the end of the file name */
                   ptr1 += 3;
                   if (*ptr1 ==  0  || *ptr1 == ' '  )
                      strcpy(urltype, "compressoutfile://");
                }
            }
        }
    }
    return(*status);
}